

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O3

int Saig_ManDetectConstr(Aig_Man_t *p,int iOut,Vec_Ptr_t **pvOuts,Vec_Ptr_t **pvCons)

{
  Aig_Obj_t *pAVar1;
  void *Entry;
  ulong uVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  void **ppvVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  char *__s;
  Aig_Obj_t *pAVar10;
  Vec_Ptr_t **ppVVar11;
  Vec_Ptr_t **ppVVar12;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t **local_58;
  Vec_Ptr_t **local_50;
  Vec_Ptr_t *local_48;
  uint local_3c;
  Vec_Ptr_t *local_38;
  
  if ((iOut < 0) || (p->nTruePos <= iOut)) {
    __assert_fail("iOut >= 0 && iOut < Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xa3,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  *pvOuts = (Vec_Ptr_t *)0x0;
  *pvCons = (Vec_Ptr_t *)0x0;
  if (p->vCos->nSize <= iOut) {
LAB_006e0bc6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar10 = *(Aig_Obj_t **)((long)p->vCos->pArray[(uint)iOut] + 8);
  pAVar1 = p->pConst1;
  if (pAVar10 == (Aig_Obj_t *)((ulong)pAVar1 ^ 1)) {
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 8;
    ppvVar5 = (void **)malloc(0x40);
    pVVar7->pArray = ppvVar5;
    pVVar7->nSize = 1;
    *ppvVar5 = pAVar1;
    *pvOuts = pVVar7;
    pVVar7 = (Vec_Ptr_t *)calloc(1,0x10);
    *pvCons = pVVar7;
    return -1;
  }
  if ((((ulong)pAVar10 & 1) != 0) || ((*(uint *)&pAVar10->field_0x18 & 7) - 7 < 0xfffffffe)) {
    __s = "The output is not an AND.";
    goto LAB_006e092c;
  }
  local_3c = iOut;
  local_48 = Saig_DetectConstrCollectSuper(pAVar10);
  lVar9 = (long)local_48->nSize;
  if (lVar9 < 2) {
    __assert_fail("Vec_PtrSize(vSuper) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xb5,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  ppvVar5 = local_48->pArray;
  lVar6 = 0;
  iVar8 = 0;
  do {
    uVar4 = 0;
    if ((((int *)((ulong)ppvVar5[lVar6] & 0xfffffffffffffffe))[6] & 7U) == 2) {
      uVar4 = (uint)(p->nTruePis <= *(int *)((ulong)ppvVar5[lVar6] & 0xfffffffffffffffe));
    }
    iVar8 = iVar8 + uVar4;
    lVar6 = lVar6 + 1;
  } while (lVar9 != lVar6);
  if (iVar8 == 0) {
    puts("There is no flop outputs.");
    free(ppvVar5);
    free(local_48);
    return 0;
  }
  lVar6 = 0;
  local_38 = (Vec_Ptr_t *)0x0;
  local_58 = pvOuts;
  local_50 = pvCons;
  do {
    Entry = ppvVar5[lVar6];
    if (((((int *)((ulong)Entry & 0xfffffffffffffffe))[6] & 7U) == 2) &&
       (iVar8 = *(int *)((ulong)Entry & 0xfffffffffffffffe), p->nTruePis <= iVar8)) {
      uVar4 = (iVar8 - p->nTruePis) + p->nTruePos;
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) goto LAB_006e0bc6;
      uVar2 = *(ulong *)((long)p->vCos->pArray[uVar4] + 8);
      if (((uVar2 & 1) != 0) &&
         (pAVar10 = (Aig_Obj_t *)(uVar2 & 0xfffffffffffffffe),
         0xfffffffd < (*(uint *)&pAVar10->field_0x18 & 7) - 7)) {
        pVVar7 = Saig_DetectConstrCollectSuper(pAVar10);
        local_60 = Saig_ManDetectConstrCheckCont(local_48,pVVar7);
        ppVVar11 = local_50;
        if (local_60 != (Vec_Ptr_t *)0x0) {
          if (((ulong)Entry & 1) != 0) {
            puts("Special flop input is complemented.");
            Vec_PtrFreeP(&local_60);
            Vec_PtrFree(pVVar7);
            ppVVar11 = local_50;
            goto LAB_006e0ab2;
          }
          if ((long)pVVar7->nSize < 1) goto LAB_006e0b52;
          lVar9 = 0;
          goto LAB_006e0b44;
        }
        if (pVVar7->pArray != (void **)0x0) {
          free(pVVar7->pArray);
        }
        local_38 = pVVar7;
        free(pVVar7);
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar9 != lVar6);
  local_60 = (Vec_Ptr_t *)0x0;
  pVVar7 = local_38;
  ppVVar11 = local_50;
LAB_006e0ab2:
  ppVVar12 = local_58;
  free(ppvVar5);
  goto LAB_006e0aba;
  while (lVar9 = lVar9 + 1, pVVar7->nSize != lVar9) {
LAB_006e0b44:
    if (pVVar7->pArray[lVar9] == Entry) {
      Vec_PtrRemove(pVVar7,Entry);
      goto LAB_006e0bb3;
    }
  }
LAB_006e0b52:
  puts("Cannot find special flop about the inputs of OR gate.");
  Vec_PtrFreeP(&local_60);
  Vec_PtrFree(pVVar7);
LAB_006e0bb3:
  ppVVar12 = local_58;
  if (ppvVar5 != (void **)0x0) goto LAB_006e0ab2;
LAB_006e0aba:
  free(local_48);
  pVVar3 = local_60;
  if (local_60 != (Vec_Ptr_t *)0x0) {
    printf("Output %d : Structural analysis found %d original properties and %d constraints.\n",
           (ulong)local_3c,(ulong)(uint)local_60->nSize,(ulong)(uint)pVVar7->nSize);
    iVar8 = pVVar7->nSize;
    *ppVVar12 = pVVar3;
    *ppVVar11 = pVVar7;
    return iVar8;
  }
  __s = "There is no structural constraints.";
LAB_006e092c:
  puts(__s);
  return 0;
}

Assistant:

int Saig_ManDetectConstr( Aig_Man_t * p, int iOut, Vec_Ptr_t ** pvOuts, Vec_Ptr_t ** pvCons )
{
    Vec_Ptr_t * vSuper, * vSuper2 = NULL, * vUnique;
    Aig_Obj_t * pObj, * pObj2, * pFlop;
    int i, nFlops, RetValue;
    assert( iOut >= 0 && iOut < Saig_ManPoNum(p) );
    *pvOuts = NULL;
    *pvCons = NULL;
    pObj = Aig_ObjChild0( Aig_ManCo(p, iOut) );
    if ( pObj == Aig_ManConst0(p) )
    {
        vUnique = Vec_PtrStart( 1 );
        Vec_PtrWriteEntry( vUnique, 0, Aig_ManConst1(p) );
        *pvOuts = vUnique;
        *pvCons = Vec_PtrAlloc( 0 );
        return -1;
    }
    if ( Aig_IsComplement(pObj) || !Aig_ObjIsNode(pObj) )
    {
        printf( "The output is not an AND.\n" );
        return 0;
    }
    vSuper = Saig_DetectConstrCollectSuper( pObj );
    assert( Vec_PtrSize(vSuper) >= 2 );
    nFlops = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        nFlops += Saig_ObjIsLo( p, Aig_Regular(pObj) );
    if ( nFlops == 0 )
    {
        printf( "There is no flop outputs.\n" );
        Vec_PtrFree( vSuper );
        return 0;
    }
    // try flops 
    vUnique = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        pFlop = Aig_Regular( pObj );
        if ( !Saig_ObjIsLo(p, pFlop) )
            continue;
        pFlop = Saig_ObjLoToLi( p, pFlop );
        pObj2 = Aig_ObjChild0( pFlop );
        if ( !Aig_IsComplement(pObj2) || !Aig_ObjIsNode(Aig_Regular(pObj2)) )
            continue;
        vSuper2 = Saig_DetectConstrCollectSuper( Aig_Regular(pObj2) );
        // every node in vSuper2 should appear in vSuper
        vUnique = Saig_ManDetectConstrCheckCont( vSuper, vSuper2 );
        if ( vUnique != NULL )
        {
///           assert( !Aig_IsComplement(pObj) );
 //           assert( Vec_PtrFind( vSuper2, pObj ) >= 0 );
            if ( Aig_IsComplement(pObj) )
            {
                printf( "Special flop input is complemented.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            {
                printf( "Cannot find special flop about the inputs of OR gate.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            // remove the flop output
            Vec_PtrRemove( vSuper2, pObj );
            break;
        }
        Vec_PtrFree( vSuper2 );
    }
    Vec_PtrFree( vSuper );
    if ( vUnique == NULL )
    {
        printf( "There is no structural constraints.\n" );
        return 0;
    }
    // vUnique contains unique entries
    // vSuper2 contains the supergate
    printf( "Output %d : Structural analysis found %d original properties and %d constraints.\n", 
        iOut, Vec_PtrSize(vUnique), Vec_PtrSize(vSuper2) );
    // remember the number of constraints
    RetValue = Vec_PtrSize(vSuper2);
    // make the AND of properties 
//    Vec_PtrFree( vUnique );
//    Vec_PtrFree( vSuper2 );
    *pvOuts = vUnique;
    *pvCons = vSuper2;
    return RetValue;
}